

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_marker(stbi__jpeg *z,int m)

{
  byte bVar1;
  stbi__context *psVar2;
  stbi_uc sVar3;
  sbyte sVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  byte *pbVar9;
  stbi_uc *psVar10;
  char *pcVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  int iVar16;
  long lVar17;
  long in_FS_OFFSET;
  bool bVar18;
  int sizes [16];
  uint local_78 [18];
  int iVar8;
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      uVar7 = stbi__get16be(z->s);
      iVar16 = uVar7 - 2;
      if (2 < uVar7) {
        do {
          psVar2 = z->s;
          pbVar9 = psVar2->img_buffer;
          if (pbVar9 < psVar2->img_buffer_end) {
LAB_00146ebe:
            psVar2->img_buffer = pbVar9 + 1;
            bVar5 = *pbVar9;
          }
          else {
            if (psVar2->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar2);
              pbVar9 = psVar2->img_buffer;
              goto LAB_00146ebe;
            }
            bVar5 = 0;
          }
          if ((0x1f < bVar5) || (bVar15 = bVar5 & 0xf, 3 < bVar15)) {
            pcVar11 = "bad DHT header";
            goto LAB_001471bd;
          }
          lVar17 = 0;
          uVar7 = 0;
          do {
            psVar2 = z->s;
            pbVar9 = psVar2->img_buffer;
            if (pbVar9 < psVar2->img_buffer_end) {
LAB_00146f1b:
              psVar2->img_buffer = pbVar9 + 1;
              uVar13 = (uint)*pbVar9;
            }
            else {
              if (psVar2->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar2);
                pbVar9 = psVar2->img_buffer;
                goto LAB_00146f1b;
              }
              uVar13 = 0;
            }
            local_78[lVar17] = uVar13;
            uVar7 = uVar7 + uVar13;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x10);
          if (bVar5 < 0x10) {
            iVar8 = stbi__build_huffman(z->huff_dc + bVar15,(int *)local_78);
            lVar17 = 8;
          }
          else {
            iVar8 = stbi__build_huffman(z->huff_ac + bVar15,(int *)local_78);
            lVar17 = 0x1a48;
          }
          if (iVar8 == 0) goto LAB_001471c6;
          if (uVar7 != 0) {
            uVar12 = 0;
            do {
              psVar2 = z->s;
              psVar10 = psVar2->img_buffer;
              if (psVar10 < psVar2->img_buffer_end) {
LAB_00146fd4:
                psVar2->img_buffer = psVar10 + 1;
                sVar3 = *psVar10;
              }
              else {
                if (psVar2->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar2);
                  psVar10 = psVar2->img_buffer;
                  goto LAB_00146fd4;
                }
                sVar3 = '\0';
              }
              z->huff_dc[bVar15].values[uVar12 + lVar17 + -8] = sVar3;
              uVar12 = uVar12 + 1;
            } while (uVar7 != uVar12);
          }
          if (0xf < bVar5) {
            lVar17 = 0;
            do {
              uVar12 = (ulong)z->huff_ac[bVar15].fast[lVar17];
              z->fast_ac[bVar15][lVar17] = 0;
              if (uVar12 != 0xff) {
                bVar5 = z->huff_ac[bVar15].values[uVar12];
                if ((bVar5 & 0xf) != 0) {
                  bVar1 = z->huff_ac[bVar15].size[uVar12];
                  uVar6 = (bVar5 & 0xf) + (ushort)bVar1;
                  if (uVar6 < 10) {
                    uVar14 = (int)lVar17 << (bVar1 & 0x1f) & 0x1ff;
                    sVar4 = (sbyte)(bVar5 & 0xf);
                    uVar13 = -1 << sVar4 | 1;
                    if (0xff < uVar14) {
                      uVar13 = 0;
                    }
                    iVar8 = uVar13 + (uVar14 >> (9U - sVar4 & 0x1f));
                    if ((char)iVar8 == iVar8) {
                      z->fast_ac[bVar15][lVar17] = (short)iVar8 * 0x100 | bVar5 & 0xfff0 | uVar6;
                    }
                  }
                }
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 != 0x200);
          }
          iVar16 = (iVar16 + -0x11) - uVar7;
        } while (0 < iVar16);
      }
    }
    else {
      if (m != 0xdb) {
LAB_00146e11:
        if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
          uVar7 = stbi__get16be(z->s);
          if (1 < uVar7) {
            if (uVar7 < 7 || m != 0xe0) {
              if (uVar7 < 0xe || m != 0xee) {
                iVar16 = uVar7 - 2;
              }
              else {
                bVar18 = true;
                lVar17 = 0;
                do {
                  psVar2 = z->s;
                  psVar10 = psVar2->img_buffer;
                  if (psVar10 < psVar2->img_buffer_end) {
LAB_0014721f:
                    psVar2->img_buffer = psVar10 + 1;
                    sVar3 = *psVar10;
                  }
                  else {
                    if (psVar2->read_from_callbacks != 0) {
                      stbi__refill_buffer(psVar2);
                      psVar10 = psVar2->img_buffer;
                      goto LAB_0014721f;
                    }
                    sVar3 = '\0';
                  }
                  if (sVar3 != "Adobe"[lVar17]) {
                    bVar18 = false;
                  }
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 6);
                if (bVar18) {
                  stbi__get8(z->s);
                  stbi__get16be(z->s);
                  stbi__get16be(z->s);
                  bVar5 = stbi__get8(z->s);
                  z->app14_color_transform = (uint)bVar5;
                  iVar16 = uVar7 - 0xe;
                }
                else {
                  iVar16 = uVar7 - 8;
                }
              }
            }
            else {
              bVar18 = true;
              lVar17 = 0;
              do {
                psVar2 = z->s;
                psVar10 = psVar2->img_buffer;
                if (psVar10 < psVar2->img_buffer_end) {
LAB_00147173:
                  psVar2->img_buffer = psVar10 + 1;
                  sVar3 = *psVar10;
                }
                else {
                  if (psVar2->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar2);
                    psVar10 = psVar2->img_buffer;
                    goto LAB_00147173;
                  }
                  sVar3 = '\0';
                }
                if (sVar3 != "JFIF"[lVar17]) {
                  bVar18 = false;
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 != 5);
              iVar16 = uVar7 - 7;
              if (bVar18) {
                z->jfif = 1;
              }
            }
            stbi__skip(z->s,iVar16);
            goto LAB_001472a4;
          }
          if (m == 0xfe) {
            pcVar11 = "bad COM len";
          }
          else {
            pcVar11 = "bad APP len";
          }
        }
        else {
          pcVar11 = "unknown marker";
        }
        goto LAB_001471bd;
      }
      uVar7 = stbi__get16be(z->s);
      iVar16 = uVar7 - 2;
      if (2 < uVar7) {
        do {
          psVar2 = z->s;
          pbVar9 = psVar2->img_buffer;
          if (pbVar9 < psVar2->img_buffer_end) {
LAB_00146d16:
            psVar2->img_buffer = pbVar9 + 1;
            bVar5 = *pbVar9;
            bVar18 = 0xf < bVar5;
            if ((bVar5 & 0xf0) != 0x10 && bVar18) {
              pcVar11 = "bad DQT type";
              goto LAB_001471bd;
            }
            uVar7 = bVar5 & 0xf;
            if (3 < uVar7) {
              pcVar11 = "bad DQT table";
              goto LAB_001471bd;
            }
          }
          else {
            if (psVar2->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar2);
              pbVar9 = psVar2->img_buffer;
              goto LAB_00146d16;
            }
            bVar18 = false;
            uVar7 = 0;
          }
          lVar17 = 0;
          do {
            psVar2 = z->s;
            if (bVar18 == false) {
              pbVar9 = psVar2->img_buffer;
              if (psVar2->img_buffer_end <= pbVar9) {
                if (psVar2->read_from_callbacks == 0) {
                  uVar6 = 0;
                  goto LAB_00146da6;
                }
                stbi__refill_buffer(psVar2);
                pbVar9 = psVar2->img_buffer;
              }
              psVar2->img_buffer = pbVar9 + 1;
              uVar6 = (ushort)*pbVar9;
            }
            else {
              iVar8 = stbi__get16be(psVar2);
              uVar6 = (ushort)iVar8;
            }
LAB_00146da6:
            *(ushort *)((long)z->dequant[0] + (ulong)""[lVar17] * 2 + (ulong)(uVar7 << 7)) = uVar6;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x40);
          iVar16 = iVar16 + (uint)(bVar18 ^ 1) * 0x40 + -0x81;
        } while (0 < iVar16);
      }
    }
    bVar18 = iVar16 == 0;
  }
  else {
    if (m == 0xdd) {
      iVar16 = stbi__get16be(z->s);
      if (iVar16 == 4) {
        iVar16 = stbi__get16be(z->s);
        z->restart_interval = iVar16;
LAB_001472a4:
        bVar18 = true;
        goto LAB_001472a6;
      }
      pcVar11 = "bad DRI len";
    }
    else {
      if (m != 0xff) goto LAB_00146e11;
      pcVar11 = "expected marker";
    }
LAB_001471bd:
    *(char **)(in_FS_OFFSET + -0x30) = pcVar11;
LAB_001471c6:
    bVar18 = false;
  }
LAB_001472a6:
  return (int)bVar18;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}